

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O1

void __thiscall IR::Instr::Dump(Instr *this,IRDumpFlags flags)

{
  IRKind IVar1;
  ushort uVar2;
  OpCode OVar3;
  undefined2 uVar4;
  Opnd *pOVar5;
  IntConstOpnd *pIVar6;
  long lVar7;
  code *pcVar8;
  BranchInstr *pBVar9;
  bool bVar10;
  bool bVar11;
  OpndKind OVar12;
  WORD WVar13;
  uint uVar14;
  uint uVar15;
  uint left;
  int32 iVar16;
  int iVar17;
  JITTimeFunctionBody *pJVar18;
  char16 *pcVar19;
  undefined4 *puVar20;
  MultiBranchInstr *pMVar21;
  ParseableFunctionInfo *pPVar22;
  undefined4 extraout_var;
  long *plVar23;
  BailOutInfo *pBVar24;
  FunctionJITTimeInfo *pFVar25;
  char16_t *pcVar26;
  uint uVar27;
  char *pcVar28;
  ulong uVar29;
  ulong uVar30;
  bool bVar31;
  wchar local_a8 [4];
  int32 temp;
  ulong local_50;
  long *local_48;
  uint local_40;
  IRDumpFlags local_3c;
  BranchInstr *local_38;
  ByteCodeUsesInstr *tempbcu;
  
  uVar4 = this->m_opcode;
  local_38 = (BranchInstr *)this;
  if ((ushort)(uVar4 - 0x207) < 2) {
    Output::SkipToColumn(0x17);
    if (this->highlight == 0) {
      WVar13 = 0;
    }
    else {
      WVar13 = Output::SetConsoleForeground(this->highlight);
    }
    pcVar19 = Js::OpCodeUtil::GetOpCodeName(this->m_opcode);
    Output::Print(L"%s ",pcVar19);
    if (this->highlight != 0) {
      Output::SetConsoleForeground(WVar13);
    }
    Output::SkipToColumn(0x26);
    if (this->m_src1 == (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar20 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar20 = 1;
      bVar11 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                          ,0x1183,"(GetSrc1())","GetSrc1()");
      if (!bVar11) goto LAB_004c49ee;
      *puVar20 = 0;
    }
    OVar12 = Opnd::GetKind(this->m_src1);
    pOVar5 = this->m_src1;
    if (OVar12 == OpndKindIntConst) {
      OVar12 = Opnd::GetKind(pOVar5);
      if (OVar12 != OpndKindIntConst) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar20 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar20 = 1;
        bVar11 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                            ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
        if (!bVar11) goto LAB_004c49ee;
        *puVar20 = 0;
      }
      Output::Print(L"%d",pOVar5[1]._vptr_Opnd);
    }
    else {
      Opnd::Dump(pOVar5,flags,this->m_func);
    }
    pIVar6 = (IntConstOpnd *)this->m_dst;
    if (pIVar6 == (IntConstOpnd *)0x0) {
      left = 0;
    }
    else {
      OVar12 = Opnd::GetKind((Opnd *)pIVar6);
      if (OVar12 != OpndKindIntConst) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar20 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar20 = 1;
        bVar11 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                            ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
        if (!bVar11) goto LAB_004c49ee;
        *puVar20 = 0;
      }
      left = IntConstOpnd::AsInt32(pIVar6);
    }
    pcVar28 = "<=";
    uVar27 = 0x2b;
    if (this->m_src2 == (Opnd *)0x0) {
      bVar11 = false;
    }
    else {
      OVar12 = Opnd::GetKind(this->m_src2);
      if (OVar12 == OpndKindIntConst) {
        pIVar6 = (IntConstOpnd *)(local_38->super_Instr).m_src2;
        OVar12 = Opnd::GetKind((Opnd *)pIVar6);
        if (OVar12 != OpndKindIntConst) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar20 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar20 = 1;
          bVar11 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                              ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
          if (!bVar11) goto LAB_004c49ee;
          *puVar20 = 0;
        }
        iVar16 = IntConstOpnd::AsInt32(pIVar6);
        bVar11 = Int32Math::Add(left,iVar16,(int32 *)local_a8);
        if (bVar11) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar20 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar20 = 1;
          bVar11 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                              ,0x1197,
                              "(!Int32Math::Add(offset, GetSrc2()->AsIntConstOpnd()->AsInt32(), &temp))"
                              ,
                              "!Int32Math::Add(offset, GetSrc2()->AsIntConstOpnd()->AsInt32(), &temp)"
                             );
          if (!bVar11) goto LAB_004c49ee;
          *puVar20 = 0;
        }
        pIVar6 = (IntConstOpnd *)(local_38->super_Instr).m_src2;
        OVar12 = Opnd::GetKind((Opnd *)pIVar6);
        if (OVar12 != OpndKindIntConst) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar20 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar20 = 1;
          bVar11 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                              ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
          if (!bVar11) goto LAB_004c49ee;
          *puVar20 = 0;
        }
        iVar16 = IntConstOpnd::AsInt32(pIVar6);
        left = left + iVar16;
        bVar11 = false;
        uVar27 = 0x2b;
      }
      else {
        bVar11 = true;
        if (left == 0xffffffff) {
          pcVar28 = "<";
          left = 0;
        }
        else {
          bVar31 = 0x80000000 < left;
          if (bVar31) {
            left = -left;
          }
          uVar27 = (uint)bVar31 * 2 + 0x2b;
        }
      }
    }
    Output::Print(L" %S ",pcVar28);
    this = &local_38->super_Instr;
    if (bVar11) {
      Opnd::Dump((local_38->super_Instr).m_src2,flags,(local_38->super_Instr).m_func);
    }
    if (left == 0) goto LAB_004c4928;
    if (bVar11) {
      Output::Print(L" %C ",(ulong)uVar27);
    }
    pcVar26 = L"%d";
  }
  else {
    Output::SkipToColumn(4);
    if (this->m_dst != (Opnd *)0x0) {
      Opnd::Dump(this->m_dst,flags,this->m_func);
      pJVar18 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
      uVar14 = JITTimeFunctionBody::GetSourceContextId(pJVar18);
      pFVar25 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
      uVar15 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar25);
      bVar11 = Js::Phases::IsEnabled((Phases *)&DAT_015ad2f8,MarkTempPhase,uVar14,uVar15);
      pBVar9 = local_38;
      bVar10 = true;
      bVar31 = true;
      if (!bVar11) {
        pJVar18 = JITTimeWorkItem::GetJITFunctionBody(((local_38->super_Instr).m_func)->m_workItem);
        uVar14 = JITTimeFunctionBody::GetSourceContextId(pJVar18);
        pFVar25 = JITTimeWorkItem::GetJITTimeInfo(((pBVar9->super_Instr).m_func)->m_workItem);
        uVar15 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar25);
        bVar31 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,MarkTempPhase,uVar14,uVar15);
      }
      pBVar9 = local_38;
      if (bVar31 == false) {
        pJVar18 = JITTimeWorkItem::GetJITFunctionBody(((local_38->super_Instr).m_func)->m_workItem);
        uVar14 = JITTimeFunctionBody::GetSourceContextId(pJVar18);
        pFVar25 = JITTimeWorkItem::GetJITTimeInfo(((pBVar9->super_Instr).m_func)->m_workItem);
        uVar15 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar25);
        bVar11 = Js::Phases::IsEnabled((Phases *)&DAT_015ad2f8,MarkTempNumberPhase,uVar14,uVar15);
        pBVar9 = local_38;
        if (!bVar11) {
          pJVar18 = JITTimeWorkItem::GetJITFunctionBody
                              (((local_38->super_Instr).m_func)->m_workItem);
          uVar14 = JITTimeFunctionBody::GetSourceContextId(pJVar18);
          pFVar25 = JITTimeWorkItem::GetJITTimeInfo(((pBVar9->super_Instr).m_func)->m_workItem);
          uVar15 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar25);
          bVar10 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,MarkTempNumberPhase,uVar14,uVar15);
        }
      }
      this = &local_38->super_Instr;
      bVar11 = true;
      if (bVar31 == false) {
        pJVar18 = JITTimeWorkItem::GetJITFunctionBody(((local_38->super_Instr).m_func)->m_workItem);
        uVar14 = JITTimeFunctionBody::GetSourceContextId(pJVar18);
        pFVar25 = JITTimeWorkItem::GetJITTimeInfo
                            (((((BranchInstr *)this)->super_Instr).m_func)->m_workItem);
        uVar15 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar25);
        bVar31 = Js::Phases::IsEnabled((Phases *)&DAT_015ad2f8,MarkTempObjectPhase,uVar14,uVar15);
        if (!bVar31) {
          pJVar18 = JITTimeWorkItem::GetJITFunctionBody
                              (((((BranchInstr *)this)->super_Instr).m_func)->m_workItem);
          uVar14 = JITTimeFunctionBody::GetSourceContextId(pJVar18);
          pFVar25 = JITTimeWorkItem::GetJITTimeInfo
                              (((((BranchInstr *)this)->super_Instr).m_func)->m_workItem);
          uVar15 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar25);
          bVar11 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,MarkTempObjectPhase,uVar14,uVar15);
        }
      }
      if (((bVar10 != false) && (((((BranchInstr *)this)->super_Instr).field_0x36 & 6) != 0)) ||
         ((bVar11 != false && (((((BranchInstr *)this)->super_Instr).field_0x36 & 8) != 0)))) {
        Output::Print(L"[");
        if ((bVar10 != false) &&
           ((DAT_015d346a != '\0' ||
            (bVar31 = OpCodeAttr::TempNumberProducing((((BranchInstr *)this)->super_Instr).m_opcode)
            , bVar31)))) {
          uVar2 = *(ushort *)&(((BranchInstr *)this)->super_Instr).field_0x36;
          if ((uVar2 & 4) == 0) {
            if ((uVar2 & 2) == 0) goto LAB_004c4360;
            pcVar19 = L"#";
          }
          else {
            pcVar19 = L"x";
            if ((uVar2 & 2) == 0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar20 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
              *puVar20 = 1;
              bVar31 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                                  ,0x11d6,"(this->dstIsTempNumber)","this->dstIsTempNumber");
              if (!bVar31) goto LAB_004c49ee;
              *puVar20 = 0;
              this = &local_38->super_Instr;
            }
          }
          Output::Print(pcVar19);
        }
LAB_004c4360:
        if ((bVar11 != false) &&
           (((DAT_015d346a != '\0' ||
             (bVar11 = OpCodeAttr::TempObjectProducing
                                 ((((BranchInstr *)this)->super_Instr).m_opcode), bVar11)) &&
            (((((BranchInstr *)this)->super_Instr).field_0x36 & 8) != 0)))) {
          Output::Print(L"o");
        }
        Output::Print(L"tmp]");
      }
      pJVar18 = JITTimeWorkItem::GetJITFunctionBody
                          (((((BranchInstr *)this)->super_Instr).m_func)->topFunc->m_workItem);
      uVar14 = JITTimeFunctionBody::GetSourceContextId(pJVar18);
      pFVar25 = JITTimeWorkItem::GetJITTimeInfo
                          (((((BranchInstr *)this)->super_Instr).m_func)->topFunc->m_workItem);
      uVar15 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar25);
      bVar11 = Js::Phases::IsEnabled((Phases *)&DAT_015ad2f8,TrackNegativeZeroPhase,uVar14,uVar15);
      if ((bVar11) && (((((BranchInstr *)this)->super_Instr).field_0x36 & 0x40) != 0)) {
        Output::Print(L"[-0]");
      }
      pJVar18 = JITTimeWorkItem::GetJITFunctionBody
                          (((((BranchInstr *)this)->super_Instr).m_func)->topFunc->m_workItem);
      uVar14 = JITTimeFunctionBody::GetSourceContextId(pJVar18);
      pFVar25 = JITTimeWorkItem::GetJITTimeInfo
                          (((((BranchInstr *)this)->super_Instr).m_func)->topFunc->m_workItem);
      uVar15 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar25);
      bVar11 = Js::Phases::IsEnabled((Phases *)&DAT_015ad2f8,TypedArrayVirtualPhase,uVar14,uVar15);
      if ((bVar11) &&
         (uVar2 = *(ushort *)&(((BranchInstr *)this)->super_Instr).field_0x36, 0x3fff < uVar2)) {
        pcVar26 = L"[->i]";
        if ((uVar2 >> 0xe & 1) == 0) {
          pcVar26 = L"[->n]";
        }
        Output::Print(pcVar26);
      }
      pJVar18 = JITTimeWorkItem::GetJITFunctionBody
                          (((((BranchInstr *)this)->super_Instr).m_func)->topFunc->m_workItem);
      uVar14 = JITTimeFunctionBody::GetSourceContextId(pJVar18);
      pFVar25 = JITTimeWorkItem::GetJITTimeInfo
                          (((((BranchInstr *)this)->super_Instr).m_func)->topFunc->m_workItem);
      uVar15 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar25);
      bVar11 = Js::Phases::IsEnabled((Phases *)&DAT_015ad2f8,TrackIntOverflowPhase,uVar14,uVar15);
      if ((bVar11) && ((*(ushort *)&(((BranchInstr *)this)->super_Instr).field_0x36 & 0x180) != 0))
      {
        if ((((BranchInstr *)this)->super_Instr).ignoreOverflowBitCount == ' ') {
          Output::Print(L"[OF]");
        }
        else {
          Output::Print(L"[OF %d]");
        }
      }
      bVar11 = ((((BranchInstr *)this)->super_Instr).field_0x38 & 0x20) == 0;
      pcVar26 = L"<==";
      if (bVar11) {
        pcVar26 = L"=";
      }
      Output::SkipToColumn((ulong)bVar11 + 0x13);
      Output::Print(pcVar26);
    }
    Output::SkipToColumn(0x17);
    WVar13 = (((BranchInstr *)this)->super_Instr).highlight;
    if (WVar13 == 0) {
      WVar13 = 0;
    }
    else {
      WVar13 = Output::SetConsoleForeground(WVar13);
    }
    pcVar19 = Js::OpCodeUtil::GetOpCodeName((((BranchInstr *)this)->super_Instr).m_opcode);
    Output::Print(L"%s ",pcVar19);
    if ((((BranchInstr *)this)->super_Instr).highlight != 0) {
      Output::SetConsoleForeground(WVar13);
    }
    Output::SkipToColumn(0x26);
    IVar1 = (((BranchInstr *)this)->super_Instr).m_kind;
    if (IVar1 == InstrKindBranch) {
      if (((BranchInstr *)this)->m_branchTarget == (LabelInstr *)0x0) {
        if (((BranchInstr *)this)->m_isMultiBranch != true) {
          Output::Print(L"??");
          goto LAB_004c4624;
        }
        pMVar21 = BranchInstr::AsMultiBrInstr((BranchInstr *)this);
        bVar11 = (((BranchInstr *)this)->super_Instr).m_opcode == MultiBr;
        if (bVar11) {
          MultiBranchInstr::MapMultiBrLabels<IR::Instr::Dump(IRDumpFlags)::__1>(pMVar21);
          goto LAB_004c4624;
        }
      }
      else {
        Output::Print(L"$L%d",(ulong)((BranchInstr *)this)->m_branchTarget->m_id);
LAB_004c4624:
        bVar11 = true;
      }
      if ((bVar11) && ((((BranchInstr *)this)->super_Instr).m_src1 != (Opnd *)0x0)) {
        Output::Print(L", ");
      }
    }
    else if ((IVar1 == InstrKindPragma) &&
            ((((BranchInstr *)this)->super_Instr).m_opcode == StatementBoundary)) {
      Output::Print(L"#%d",(ulong)*(uint *)&((BranchInstr *)this)->field_0x58);
    }
    pOVar5 = (((BranchInstr *)this)->super_Instr).m_src1;
    if (((((BranchInstr *)this)->super_Instr).m_opcode & ~ExtendedOpcodePrefix) == NewScFunc) {
      OVar12 = Opnd::GetKind(pOVar5);
      if (OVar12 != OpndKindIntConst) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar20 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar20 = 1;
        bVar11 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                            ,0x1245,"(src1->IsIntConstOpnd())","src1->IsIntConstOpnd()");
        if (!bVar11) goto LAB_004c49ee;
        *puVar20 = 0;
      }
      pJVar18 = JITTimeWorkItem::GetJITFunctionBody
                          (((((BranchInstr *)this)->super_Instr).m_func)->m_workItem);
      pPVar22 = (ParseableFunctionInfo *)JITTimeFunctionBody::GetAddr(pJVar18);
      OVar12 = Opnd::GetKind(pOVar5);
      if (OVar12 != OpndKindIntConst) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar20 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar20 = 1;
        bVar11 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                            ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
        if (!bVar11) goto LAB_004c49ee;
        *puVar20 = 0;
        this = &local_38->super_Instr;
      }
      pPVar22 = Js::ParseableFunctionInfo::GetNestedFunctionForExecution
                          (pPVar22,*(uint *)&pOVar5[1]._vptr_Opnd);
      pPVar22 = Js::FunctionProxy::GetParseableFunctionInfo(&pPVar22->super_FunctionProxy);
      if (pPVar22 == (ParseableFunctionInfo *)0x0) {
        pcVar26 = L"???";
      }
      else {
        iVar17 = (*(pPVar22->super_FunctionProxy).super_FinalizableObject.
                   super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(pPVar22);
        pcVar26 = (char16_t *)CONCAT44(extraout_var,iVar17);
      }
      Output::Print(L"func:%s()",pcVar26);
      Output::Print(L", env:");
      pOVar5 = (((BranchInstr *)this)->super_Instr).m_src2;
      OVar12 = Opnd::GetKind(pOVar5);
      if (OVar12 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar20 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar20 = 1;
        bVar11 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                            ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar11) {
LAB_004c49ee:
          pcVar8 = (code *)invalidInstructionException();
          (*pcVar8)();
        }
        *puVar20 = 0;
      }
      Sym::Dump((Sym *)pOVar5[1]._vptr_Opnd,flags,(ValueType)0x9);
    }
    else if (pOVar5 != (Opnd *)0x0) {
      Opnd::Dump(pOVar5,flags,(((BranchInstr *)this)->super_Instr).m_func);
      pOVar5 = (((BranchInstr *)this)->super_Instr).m_src2;
      if (pOVar5 != (Opnd *)0x0) {
        Output::Print(L", ");
        Opnd::Dump(pOVar5,flags,(((BranchInstr *)this)->super_Instr).m_func);
      }
    }
    OVar3 = (((BranchInstr *)this)->super_Instr).m_opcode;
    if (OVar3 != SpeculatedLoadFence &&
        (OVar3 != ByteCodeUses ||
        (((BranchInstr *)this)->super_Instr).m_kind != InstrKindByteCodeUses)) goto LAB_004c4928;
    local_3c = flags;
    if ((*(long **)&((BranchInstr *)this)->field_0x58 != (long *)0x0) &&
       (plVar23 = (long *)**(long **)&((BranchInstr *)this)->field_0x58, plVar23 != (long *)0x0)) {
      bVar11 = true;
      do {
        uVar29 = plVar23[2];
        local_48 = plVar23;
        if (uVar29 != 0) {
          local_50 = (ulong)*(uint *)(plVar23 + 1);
          uVar30 = 0;
          if (uVar29 != 0) {
            for (; (uVar29 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
            }
          }
          pcVar26 = L", s%d";
          if (bVar11) {
            pcVar26 = L"s%d";
          }
          do {
            local_40 = (int)local_50 + (BVIndex)uVar30;
            BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar30);
            uVar29 = uVar29 & ~(1L << (uVar30 & 0x3f));
            bVar11 = false;
            Output::Print(pcVar26,(ulong)local_40);
            lVar7 = 0;
            if (uVar29 != 0) {
              for (; (uVar29 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
              }
            }
            uVar30 = (ulong)(-(uint)(uVar29 == 0) | (uint)lVar7);
            pcVar26 = L", s%d";
          } while (uVar29 != 0);
        }
        plVar23 = (long *)*local_48;
      } while (plVar23 != (long *)0x0);
    }
    this = &local_38->super_Instr;
    flags = local_3c;
    if (local_38->m_regContent == (Lifetime **)0x0) goto LAB_004c4928;
    left = *(uint *)(local_38->m_regContent + 2);
    pcVar26 = L"  PropSym: %d";
  }
  Output::Print(pcVar26,(ulong)left);
LAB_004c4928:
  if ((flags & (IRDumpFlags_SkipByteCodeOffset|IRDumpFlags_AsmDumpMode)) == IRDumpFlags_None) {
    DumpByteCodeOffset(this);
  }
  if (((flags & IRDumpFlags_SimpleForm) == IRDumpFlags_None) &&
     (((((BranchInstr *)this)->super_Instr).field_0x38 & 0x50) != 0)) {
    pBVar24 = GetBailOutInfo(this);
    Output::SkipToColumn(0x55);
    if ((flags & IRDumpFlags_AsmDumpMode) == IRDumpFlags_None) {
      Output::Print(L"Bailout: #%04x",(ulong)pBVar24->bailOutOffset);
    }
    if (pBVar24->bailOutFunc->parentFunc != (Func *)0x0) {
      pFVar25 = JITTimeWorkItem::GetJITTimeInfo(pBVar24->bailOutFunc->m_workItem);
      pcVar19 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar25,(wchar (*) [42])local_a8);
      Output::Print(L" Func %s",pcVar19);
    }
    pcVar28 = GetBailOutKindName(this);
    Output::Print(L" (%S)",pcVar28);
  }
  if ((flags & IRDumpFlags_SkipEndLine) == IRDumpFlags_None) {
    Output::Print(L"\n");
  }
  return;
}

Assistant:

void
Instr::Dump(IRDumpFlags flags)
{
    bool const AsmDumpMode = flags & IRDumpFlags_AsmDumpMode;
    bool const SimpleForm = !!(flags & IRDumpFlags_SimpleForm);
    bool const SkipByteCodeOffset = !!(flags & IRDumpFlags_SkipByteCodeOffset);

    const auto PrintOpCodeName = [&]() {
        Output::SkipToColumn(23);
#if DBG
        WORD oldValue = 0;
        if (this->highlight != 0)
        {
            oldValue = Output::SetConsoleForeground(this->highlight);
        }
#endif
        Output::Print(_u("%s "), Js::OpCodeUtil::GetOpCodeName(m_opcode));
#if DBG
        if (this->highlight != 0)
        {
            Output::SetConsoleForeground(oldValue);
        }
#endif
        Output::SkipToColumn(38);
    };

    // forward decl before goto statement
    Opnd * dst = nullptr;

    if(m_opcode == Js::OpCode::BoundCheck || m_opcode == Js::OpCode::UnsignedBoundCheck)
    {
        PrintOpCodeName();

        // src1 <= src2 + dst

        Assert(GetSrc1());
        if(GetSrc1()->IsIntConstOpnd())
        {
            Output::Print(_u("%d"), GetSrc1()->AsIntConstOpnd()->GetValue());
        }
        else
        {
            GetSrc1()->Dump(flags, m_func);
        }

        bool useLessThanOrEqual = true;
        bool usePlus = true;
        bool dumpSrc2 = false;
        int32 offset = GetDst() ? GetDst()->AsIntConstOpnd()->AsInt32() : 0;
        if(GetSrc2())
        {
            if(GetSrc2()->IsIntConstOpnd())
            {
            #if DBG
                int32 temp;
                Assert(!Int32Math::Add(offset, GetSrc2()->AsIntConstOpnd()->AsInt32(), &temp));
            #endif
                offset += GetSrc2()->AsIntConstOpnd()->AsInt32();
            }
            else
            {
                dumpSrc2 = true;
                if(offset == -1)
                {
                    useLessThanOrEqual = false; // < instead of <=
                    offset = 0;
                }
                else if(offset < 0 && offset != IntConstMin)
                {
                    usePlus = false;
                    offset = -offset;
                }
            }
        }

        Output::Print(_u(" %S "), useLessThanOrEqual ? "<=" : "<");
        if(dumpSrc2)
        {
            GetSrc2()->Dump(flags, m_func);
        }
        if(offset != 0)
        {
            if(dumpSrc2)
            {
                Output::Print(_u(" %C "), usePlus ? '+' : '-');
            }
            Output::Print(_u("%d"), offset);
        }

        goto PrintByteCodeOffsetEtc;
    }

    Output::SkipToColumn(4);

    dst = this->GetDst();

    if (dst)
    {
        dst->Dump(flags, this->m_func);

        bool const dumpMarkTemp = PHASE_DUMP(Js::MarkTempPhase, m_func)
            || PHASE_TRACE(Js::MarkTempPhase, m_func);
        bool const dumpMarkTempNumber = dumpMarkTemp || PHASE_DUMP(Js::MarkTempNumberPhase, m_func)
            || PHASE_TRACE(Js::MarkTempNumberPhase, m_func);
        bool const dumpMarkTempObject = dumpMarkTemp || PHASE_DUMP(Js::MarkTempObjectPhase, m_func)
            || PHASE_TRACE(Js::MarkTempObjectPhase, m_func);

        if ((dumpMarkTempNumber && (this->dstIsTempNumberTransferred || this->dstIsTempNumber))
            || (dumpMarkTempObject && this->dstIsTempObject))
        {
            Output::Print(_u("["));

            if (dumpMarkTempNumber)
            {
                if (Js::Configuration::Global.flags.Verbose || OpCodeAttr::TempNumberProducing(this->m_opcode))
                {
                    if (this->dstIsTempNumberTransferred)
                    {
                        Assert(this->dstIsTempNumber);
                        Output::Print(_u("x"));
                    }
                    else if (this->dstIsTempNumber)
                    {
                        Output::Print(_u("#"));
                    }
                }
            }
            if (dumpMarkTempObject)
            {
                if (Js::Configuration::Global.flags.Verbose || OpCodeAttr::TempObjectProducing(this->m_opcode))
                {
                    if (this->dstIsTempObject)
                    {
                        Output::Print(_u("o"));
                    }
                }
            }

            Output::Print(_u("tmp]"));
        }
        if(PHASE_DUMP(Js::TrackNegativeZeroPhase, m_func->GetTopFunc()) && !ShouldCheckForNegativeZero())
        {
            Output::Print(_u("[-0]"));
        }
        if (PHASE_DUMP(Js::TypedArrayVirtualPhase, m_func->GetTopFunc()) && (!IsDstNotAlwaysConvertedToInt32() || !IsDstNotAlwaysConvertedToNumber()))
        {
            if (!IsDstNotAlwaysConvertedToInt32())
                Output::Print(_u("[->i]"));
            else
                Output::Print(_u("[->n]"));

        }
        if(PHASE_DUMP(Js::TrackIntOverflowPhase, m_func->GetTopFunc()))
        {
            // ignoring 32-bit overflow ?
            if(!ShouldCheckFor32BitOverflow())
            {
                // ignoring 32-bits or more ?
                if(ShouldCheckForNon32BitOverflow())
                    Output::Print(_u("[OF %d]"), ignoreOverflowBitCount);
                else
                    Output::Print(_u("[OF]"));
            }
        }

        if (this->isSafeToSpeculate)
        {
            Output::SkipToColumn(19);
            Output::Print(_u("<=="));
        }
        else
        {
            Output::SkipToColumn(20);
            Output::Print(_u("="));
        }
    }

    PrintOpCodeName();

    if (this->IsBranchInstr())
    {
        BranchInstr * branchInstr = this->AsBranchInstr();
        LabelInstr * targetInstr = branchInstr->GetTarget();
        bool labelPrinted = true;
        if (targetInstr == NULL)
        {
            // Checking the 'm_isMultiBranch' field here directly as well to bypass asserting when tracing IR builder
            if(branchInstr->m_isMultiBranch && branchInstr->IsMultiBranch())
            {
                IR::MultiBranchInstr * multiBranchInstr = branchInstr->AsMultiBrInstr();

                // If this MultiBranchInstr has been lowered to a machine instruction, which means
                // its opcode is not Js::OpCode::MultiBr, there is no need to print the labels.
                if (this->m_opcode == Js::OpCode::MultiBr)
                {
                    multiBranchInstr->MapMultiBrLabels([](IR::LabelInstr * labelInstr) -> void
                    {
                        Output::Print(_u("$L%d "), labelInstr->m_id);
                    });
                }
                else
                {
                    labelPrinted = false;
                }
            }
            else
            {
                Output::Print(_u("??"));
            }
        }
        else
        {
            Output::Print(_u("$L%d"), targetInstr->m_id);
        }
        if (this->GetSrc1() && labelPrinted)
        {
            Output::Print(_u(", "));
        }
    }
    else if (this->IsPragmaInstr() && this->m_opcode == Js::OpCode::StatementBoundary)
    {
        Output::Print(_u("#%d"), this->AsPragmaInstr()->m_statementIndex);
    }

    // scope
    {
        Opnd * src1 = this->GetSrc1();
        if (this->m_opcode == Js::OpCode::NewScFunc || this->m_opcode == Js::OpCode::NewScGenFunc)
        {
            Assert(src1->IsIntConstOpnd());
            Js::ParseableFunctionInfo * function = nullptr;
            if (!m_func->IsOOPJIT())
            {
                function = ((Js::ParseableFunctionInfo *)m_func->GetJITFunctionBody()->GetAddr())->GetNestedFunctionForExecution((uint)src1->AsIntConstOpnd()->GetValue())->GetParseableFunctionInfo();
            }
            Output::Print(_u("func:%s()"), function ? function->GetDisplayName() : _u("???"));
            Output::Print(_u(", env:"));
            this->GetSrc2()->AsRegOpnd()->m_sym->Dump(flags);
        }
        else if (src1)
        {
            src1->Dump(flags, this->m_func);
            Opnd * src2 = this->GetSrc2();
            if (src2)
            {
                Output::Print(_u(", "));
                src2->Dump(flags, this->m_func);
            }
        }
    }

    if (this->IsByteCodeUsesInstr() || this->m_opcode == Js::OpCode::SpeculatedLoadFence)
    {
        ByteCodeUsesInstr* tempbcu = static_cast<ByteCodeUsesInstr*>(this);
        if (tempbcu->GetByteCodeUpwardExposedUsed())
        {
            bool first = true;
            FOREACH_BITSET_IN_SPARSEBV(id, tempbcu->GetByteCodeUpwardExposedUsed())
            {
                Output::Print(first? _u("s%d") : _u(", s%d"), id);
                first = false;
            }
            NEXT_BITSET_IN_SPARSEBV;
        }
        if (tempbcu->propertySymUse)
        {
            Output::Print(_u("  PropSym: %d"), tempbcu->propertySymUse->m_id);
        }
    }

PrintByteCodeOffsetEtc:
    if (!AsmDumpMode && !SkipByteCodeOffset)
    {
        this->DumpByteCodeOffset();
    }

    if (!SimpleForm)
    {
        if (this->HasBailOutInfo() || this->HasAuxBailOut())
        {
            BailOutInfo * bailOutInfo = this->GetBailOutInfo();
            Output::SkipToColumn(85);
            if (!AsmDumpMode)
            {
                Output::Print(_u("Bailout: #%04x"), bailOutInfo->bailOutOffset);
            }
            if (!bailOutInfo->bailOutFunc->IsTopFunc())
            {
                char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                Output::Print(_u(" Func %s"), bailOutInfo->bailOutFunc->GetDebugNumberSet(debugStringBuffer));
            }
            Output::Print(_u(" (%S)"), this->GetBailOutKindName());
        }
    }
    if ((flags & IRDumpFlags_SkipEndLine) == 0)
    {
        Output::Print(_u("\n"));
    }
}